

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::handleFunctionBody
          (HlslParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *functionBody,
          TIntermNode **node)

{
  TIntermediate *this_00;
  TIntermNode *node_00;
  TFunction *pTVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  TIntermAggregate *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pool_allocator<char> local_60;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  TIntermNode **local_30;
  TIntermNode **node_local;
  TIntermNode *functionBody_local;
  TFunction *function_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  local_30 = node;
  node_local = (TIntermNode **)functionBody;
  functionBody_local = (TIntermNode *)function;
  function_local = (TFunction *)loc;
  loc_local = (TSourceLoc *)this;
  pTVar5 = TIntermediate::growAggregate
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,*node,
                      functionBody);
  *local_30 = (TIntermNode *)pTVar5;
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  node_00 = *local_30;
  iVar2 = (*functionBody_local->_vptr_TIntermNode[0xc])();
  TIntermediate::setAggregateOperator
            (this_00,node_00,EOpFunction,(TType *)CONCAT44(extraout_var,iVar2),
             (TSourceLoc *)function_local);
  iVar2 = (*(*local_30)->_vptr_TIntermNode[6])();
  iVar3 = (*functionBody_local->_vptr_TIntermNode[6])();
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   CONCAT44(extraout_var_01,iVar3));
  pool_allocator<char>::pool_allocator(&local_60);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
             pcVar6,&local_60);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x1a0))
            ((long *)CONCAT44(extraout_var_00,iVar2),&local_58);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_58);
  popScope(this);
  uVar4 = (*functionBody_local->_vptr_TIntermNode[0x21])();
  if ((uVar4 & 1) != 0) {
    popImplicitThis(this);
  }
  iVar2 = (*functionBody_local->_vptr_TIntermNode[0xc])();
  iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x38))();
  pTVar1 = function_local;
  if ((iVar2 != 0) && (((this->super_TParseContextBase).functionReturnsValue & 1U) == 0)) {
    iVar2 = (*functionBody_local->_vptr_TIntermNode[3])();
    pcVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_03,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar1,"function does not return a value:","",pcVar6);
  }
  return;
}

Assistant:

void HlslParseContext::handleFunctionBody(const TSourceLoc& loc, TFunction& function, TIntermNode* functionBody,
                                          TIntermNode*& node)
{
    node = intermediate.growAggregate(node, functionBody);
    intermediate.setAggregateOperator(node, EOpFunction, function.getType(), loc);
    node->getAsAggregate()->setName(function.getMangledName().c_str());

    popScope();
    if (function.hasImplicitThis())
        popImplicitThis();

    if (function.getType().getBasicType() != EbtVoid && ! functionReturnsValue)
        error(loc, "function does not return a value:", "", function.getName().c_str());
}